

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNameOfClass.cxx
# Opt level: O3

size_t __thiscall kws::Parser::GetClassPosition(Parser *this,size_t position,string *buffer)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  string nameOfClass;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  uVar5 = 0;
  if (position != 0xffffffffffffffff) {
    uVar5 = position;
  }
  if (buffer->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)buffer);
  }
  uVar5 = std::__cxx11::string::find((char *)buffer,0x176916,uVar5);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  if (uVar5 != 0xffffffffffffffff) {
    do {
      pcVar2 = (buffer->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + buffer->_M_string_length);
      bVar4 = IsBetweenCharsFast(this,'<','>',uVar5,false,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (!bVar4) {
        uVar10 = 1;
        if (1 < uVar5) {
          bVar1 = (buffer->_M_dataplus)._M_p[uVar5 - 1];
          if (bVar1 < 0x30) {
            uVar10 = 0x800100000400 >> (bVar1 & 0x3f);
          }
          else {
            uVar10 = 0;
          }
        }
        if (((uVar5 < buffer->_M_string_length - 2) &&
            (cVar9 = (buffer->_M_dataplus)._M_p[uVar5 + 5], cVar9 != ' ')) && (cVar9 != '/')) {
          uVar10 = (ulong)(cVar9 == '\r' & (byte)uVar10);
        }
        uVar6 = std::__cxx11::string::find((char)buffer,0x7b);
        uVar7 = std::__cxx11::string::find((char)buffer,0x3b);
        if (uVar6 < uVar7) {
          uVar6 = uVar5 + 4;
          pcVar2 = (buffer->_M_dataplus)._M_p;
          cVar9 = pcVar2[uVar6];
          uVar7 = uVar6;
          if (cVar9 != '{') {
            uVar3 = buffer->_M_string_length;
            uVar8 = uVar6;
            if (uVar6 < uVar3) {
              uVar8 = uVar3;
            }
            do {
              uVar7 = uVar8;
              if ((uVar3 <= uVar6) || (uVar7 = uVar6, cVar9 == ':')) break;
              if (cVar9 == ';') goto LAB_0015400b;
              cVar9 = pcVar2[uVar6 + 1];
              uVar6 = uVar6 + 1;
              uVar7 = uVar6;
            } while (cVar9 != '{');
          }
          if ((uVar10 & 1) != 0) goto LAB_00154039;
        }
      }
LAB_0015400b:
      uVar5 = std::__cxx11::string::find((char *)buffer,0x176916,uVar5 + 1);
    } while (uVar5 != 0xffffffffffffffff);
  }
  uVar7 = 0xffffffffffffffff;
LAB_00154039:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return uVar7;
}

Assistant:

size_t Parser::GetClassPosition(size_t position,std::string buffer) const
{
  if(position == std::string::npos)
   {
   position = 0;
   }

   if (buffer.empty()) {
     buffer = m_BufferNoComment;
   }

  size_t pos = buffer.find("class",position);

  std::string nameOfClass = "";
  while(pos!=std::string::npos)
    {
    if(!this->IsBetweenCharsFast('<','>',pos,false,buffer))
      {
      bool valid = true;      
      // We check that the word class is alone
      if(pos>1)
        {
        if(buffer[pos-1] != ' ' && buffer[pos-1] != '/' && buffer[pos-1] != '\n')
          {
          valid = false;
          }
        }
      if(pos<buffer.size()-2)
        {
        if(buffer[pos+5] != ' ' && buffer[pos+5] != '/' && buffer[pos+5] != '\r')
          {
          valid = false;
          } 
        }
      
      size_t i = pos+4;
      // We should get a { before a ;
      size_t brac = buffer.find('{',pos);
      size_t sem = buffer.find(';',pos);

      if(sem<=brac)
        {
        valid = false;
        }
      else
        {
        while((buffer[i] != '{')
          && (i<buffer.size())
          )
          {
          if(buffer[i] == ';')
            {
            valid = false;
            break;
            }
          else if(buffer[i] == ':')
            {
            break;
            }
          i++;
          }
        }
      
      if(valid)
        {
        return i;
        }
      }
    pos = buffer.find("class",pos+1);
    }

  return std::string::npos;
}